

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O2

void __thiscall
QDockAreaLayout::resizeDocks
          (QDockAreaLayout *this,QList<QDockWidget_*> *docks,QList<int> *sizes,Orientation o)

{
  bool bVar1;
  QDockAreaLayoutInfo *pQVar2;
  pointer pQVar3;
  QSize QVar4;
  Representation RVar5;
  QDockAreaLayoutItem *item;
  QDockAreaLayoutItem *this_00;
  int iVar6;
  ulong uVar7;
  long lVar8;
  QRect *this_01;
  int iVar9;
  Representation RVar10;
  ulong uVar11;
  long in_FS_OFFSET;
  QArrayDataPointer<int> local_78;
  char local_58 [24];
  char *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar11 = (docks->d).size;
  if (uVar11 == (sizes->d).size) {
    this->fallbackToSizeHints = false;
    uVar7 = uVar11 & 0xffffffff;
    if ((int)uVar11 < 1) {
      uVar7 = 0;
    }
    for (uVar11 = 0; uVar11 != uVar7; uVar11 = uVar11 + 1) {
      local_78.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_78.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_78.ptr = (int *)&DAT_aaaaaaaaaaaaaaaa;
      indexOf((QList<int> *)&local_78,this,&(docks->d).ptr[uVar11]->super_QWidget);
      if ((undefined1 *)local_78.size == (undefined1 *)0x0) {
        local_58[0] = '\x02';
        local_58[1] = '\0';
        local_58[2] = '\0';
        local_58[3] = '\0';
        local_58[4] = '\0';
        local_58[5] = '\0';
        local_58[6] = '\0';
        local_58[7] = '\0';
        local_58[8] = '\0';
        local_58[9] = '\0';
        local_58[10] = '\0';
        local_58[0xb] = '\0';
        local_58[0xc] = '\0';
        local_58[0xd] = '\0';
        local_58[0xe] = '\0';
        local_58[0xf] = '\0';
        local_58[0x10] = '\0';
        local_58[0x11] = '\0';
        local_58[0x12] = '\0';
        local_58[0x13] = '\0';
        local_58[0x14] = '\0';
        local_58[0x15] = '\0';
        local_58[0x16] = '\0';
        local_58[0x17] = '\0';
        local_40 = "default";
        QMessageLogger::warning
                  (local_58,"QMainWidget::resizeDocks: one QDockWidget is not part of the layout");
      }
      else {
        iVar9 = (sizes->d).ptr[uVar11];
        if (iVar9 < 1) {
          local_58[0] = '\x02';
          local_58[1] = '\0';
          local_58[2] = '\0';
          local_58[3] = '\0';
          local_58[4] = '\0';
          local_58[5] = '\0';
          local_58[6] = '\0';
          local_58[7] = '\0';
          local_58[8] = '\0';
          local_58[9] = '\0';
          local_58[10] = '\0';
          local_58[0xb] = '\0';
          local_58[0xc] = '\0';
          local_58[0xd] = '\0';
          local_58[0xe] = '\0';
          local_58[0xf] = '\0';
          local_58[0x10] = '\0';
          local_58[0x11] = '\0';
          local_58[0x12] = '\0';
          local_58[0x13] = '\0';
          local_58[0x14] = '\0';
          local_58[0x15] = '\0';
          local_58[0x16] = '\0';
          local_58[0x17] = '\0';
          local_40 = "default";
          QMessageLogger::warning
                    (local_58,"QMainWidget::resizeDocks: all sizes need to be larger than 0");
          iVar9 = 1;
        }
        while ((undefined1 *)0x1 < (ulong)local_78.size) {
          pQVar2 = info(this,(QList<int> *)&local_78);
          if ((pQVar2->tabbed == false) && (pQVar2->o == o)) {
            iVar6 = local_78.ptr[(long)(local_78.size + -1)];
            pQVar3 = QList<QDockAreaLayoutItem>::data(&pQVar2->item_list);
            pQVar3[iVar6].size = iVar9;
            this_00 = (pQVar2->item_list).d.ptr;
            iVar9 = 0;
            for (lVar8 = (pQVar2->item_list).d.size * 0x28; lVar8 != 0; lVar8 = lVar8 + -0x28) {
              bVar1 = QDockAreaLayoutItem::skip(this_00);
              if (!bVar1) {
                iVar6 = this->sep + iVar9;
                if (iVar9 == 0) {
                  iVar6 = 0;
                }
                RVar10.m_i = this_00->size;
                if (this_00->size == -1) {
                  QVar4 = QDockAreaLayoutItem::sizeHint(this_00);
                  RVar10.m_i = QVar4.ht.m_i.m_i;
                  if (o == Horizontal) {
                    RVar10.m_i = QVar4.wd.m_i.m_i;
                  }
                }
                iVar9 = RVar10.m_i + iVar6;
              }
              this_00 = this_00 + 1;
            }
          }
          QList<int>::removeLast((QList<int> *)&local_78);
        }
        iVar6 = *local_78.ptr;
        this_01 = &this->docks[iVar6].rect;
        QVar4 = QRect::size(this_01);
        RVar10.m_i = QVar4.wd.m_i.m_i;
        if (o == Horizontal) {
          RVar10.m_i = iVar9;
        }
        RVar5.m_i = QVar4.ht.m_i.m_i;
        if (o != Horizontal) {
          RVar5.m_i = iVar9;
        }
        iVar9 = this->docks[iVar6].rect.y1.m_i;
        this->docks[iVar6].rect.x2.m_i = RVar10.m_i + (this_01->x1).m_i + -1;
        this->docks[iVar6].rect.y2.m_i = RVar5.m_i + iVar9 + -1;
      }
      QArrayDataPointer<int>::~QArrayDataPointer(&local_78);
    }
  }
  else {
    local_58[0] = '\x02';
    local_58[1] = '\0';
    local_58[2] = '\0';
    local_58[3] = '\0';
    local_58[0x14] = '\0';
    local_58[0x15] = '\0';
    local_58[0x16] = '\0';
    local_58[0x17] = '\0';
    local_58[4] = '\0';
    local_58[5] = '\0';
    local_58[6] = '\0';
    local_58[7] = '\0';
    local_58[8] = '\0';
    local_58[9] = '\0';
    local_58[10] = '\0';
    local_58[0xb] = '\0';
    local_58[0xc] = '\0';
    local_58[0xd] = '\0';
    local_58[0xe] = '\0';
    local_58[0xf] = '\0';
    local_58[0x10] = '\0';
    local_58[0x11] = '\0';
    local_58[0x12] = '\0';
    local_58[0x13] = '\0';
    local_40 = "default";
    QMessageLogger::warning(local_58,"QMainWidget::resizeDocks: size of the lists are not the same")
    ;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QDockAreaLayout::resizeDocks(const QList<QDockWidget *> &docks,
                                  const QList<int> &sizes, Qt::Orientation o)
{
    if (Q_UNLIKELY(docks.size() != sizes.size())) {
        qWarning("QMainWidget::resizeDocks: size of the lists are not the same");
        return;
    }
    int count = docks.size();
    fallbackToSizeHints = false;
    for (int i = 0; i < count; ++i) {
        QList<int> path = indexOf(docks[i]);
        if (Q_UNLIKELY(path.isEmpty())) {
            qWarning("QMainWidget::resizeDocks: one QDockWidget is not part of the layout");
            continue;
        }
        int size = sizes[i];
        if (Q_UNLIKELY(size <= 0)) {
            qWarning("QMainWidget::resizeDocks: all sizes need to be larger than 0");
            size = 1;
        }

        while (path.size() > 1) {
            QDockAreaLayoutInfo *info = this->info(path);
#if QT_CONFIG(tabbar)
            if (!info->tabbed && info->o == o) {
                info->item_list[path.constLast()].size = size;
                int totalSize = 0;
                for (const QDockAreaLayoutItem &item : std::as_const(info->item_list)) {
                    if (!item.skip()) {
                        if (totalSize != 0)
                            totalSize += sep;
                        totalSize += item.size == -1 ? pick(o, item.sizeHint()) : item.size;
                    }
                }
                size = totalSize;
            }
#endif // QT_CONFIG(tabbar)
            path.removeLast();
        }

        const int dockNum = path.constFirst();
        Q_ASSERT(dockNum < QInternal::DockCount);
        QRect &r = this->docks[dockNum].rect;
        QSize s = r.size();
        rpick(o, s) = size;
        r.setSize(s);
    }
}